

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<void_()>::TypedExpectation
          (TypedExpectation<void_()> *this,FunctionMockerBase<void_()> *owner,char *a_file,
          int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  int in_ECX;
  char *in_RDX;
  ExpectationBase *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  tuple<void,_void,_void,_void,_void,_void,_void,_void,_void,_void> *in_R9;
  DoDefaultAction *this_00;
  
  ExpectationBase::ExpectationBase(in_RSI,in_RDX,in_ECX,in_R8);
  *in_RDI = &PTR__TypedExpectation_002655e8;
  in_RDI[0x1d] = in_RSI;
  std::tr1::tuple<void,_void,_void,_void,_void,_void,_void,_void,_void,_void>::tuple
            ((tuple<void,_void,_void,_void,_void,_void,_void,_void,_void,_void> *)(in_RDI + 0x1e),
             in_R9);
  A<std::tr1::tuple<void,void,void,void,void,void,void,void,void,void>const&>();
  this_00 = (DoDefaultAction *)(in_RDI + 0x22);
  DoDefault();
  DoDefaultAction::operator_cast_to_Action(this_00);
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}